

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deRandom.hpp
# Opt level: O1

void __thiscall
de::Random::choose<rsg::ValueEntryIterator<rsg::IsWritableEntry>,rsg::ValueEntry_const**>
          (Random *this,ValueEntryIterator<rsg::IsWritableEntry> first,
          ValueEntryIterator<rsg::IsWritableEntry> last,ValueEntry **result,int numItems)

{
  Storage SVar1;
  ValueEntry **ppVVar2;
  deUint32 dVar3;
  uint uVar4;
  uint uVar5;
  
  if (first.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current !=
      last.
      super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
      .m_iter._M_current) {
    uVar5 = 0;
    do {
      uVar4 = uVar5;
      if ((int)uVar5 < numItems) {
LAB_0014ada7:
        result[(int)uVar4] =
             *first.
              super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
              .m_iter._M_current;
      }
      else {
        dVar3 = deRandom_getUint32(&this->m_rnd);
        uVar4 = dVar3 % (uVar5 + 1);
        if ((int)uVar4 < numItems) goto LAB_0014ada7;
      }
      ppVVar2 = first.
                super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
                .m_iter._M_current + 1;
      do {
        first.
        super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
        .m_iter._M_current = ppVVar2;
        if (first.
            super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
            .m_iter._M_current ==
            first.
            super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
            .m_end._M_current) break;
        SVar1 = (*first.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
                  .m_iter._M_current)->m_variable->m_storage;
        ppVVar2 = first.
                  super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
                  .m_iter._M_current + 1;
      } while ((STORAGE_PARAMETER_INOUT < SVar1) || ((0xe5U >> (SVar1 & 0x1f) & 1) == 0));
      uVar5 = uVar5 + 1;
    } while (first.
             super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
             .m_iter._M_current !=
             last.
             super_FilteredIterator<const_rsg::ValueEntry_*,___gnu_cxx::__normal_iterator<const_rsg::ValueEntry_*const_*,_std::vector<const_rsg::ValueEntry_*,_std::allocator<const_rsg::ValueEntry_*>_>_>,_rsg::IsWritableEntry>
             .m_iter._M_current);
  }
  return;
}

Assistant:

void Random::choose (InputIter first, InputIter last, OutputIter result, int numItems)
{
	// Algorithm: Reservoir sampling
	// http://en.wikipedia.org/wiki/Reservoir_sampling
	// \note Will not work for suffling an array. Use suffle() instead.

	int ndx;
	for (ndx = 0; first != last; ++first, ++ndx)
	{
		if (ndx < numItems)
			*(result + ndx) = *first;
		else
		{
			int r = getInt(0, ndx);
			if (r < numItems)
				*(result + r) = *first;
		}
	}

	DE_ASSERT(ndx >= numItems);
}